

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O2

longlong anon_unknown.dwarf_13aa20::GetLongPow(longlong number,longlong power)

{
  long lVar1;
  long lVar2;
  
  if (power < 0) {
    if (number == 1) {
      return 1;
    }
    if (number == -1) {
      return -(ulong)((uint)power & 1) | 1;
    }
    lVar1 = 0;
  }
  else {
    lVar1 = 1;
    for (; power != 0; power = (ulong)power >> 1) {
      lVar2 = 1;
      if ((power & 1U) != 0) {
        lVar2 = number;
      }
      lVar1 = lVar1 * lVar2;
      number = number * number;
    }
  }
  return lVar1;
}

Assistant:

long long GetLongPow(long long number, long long power)
	{
		if(power < 0)
			return number == 1 ? 1 : (number == -1 ? ((power & 1) ? -1 : 1) : 0);

		long long result = 1;
		while(power)
		{
			if(power & 1)
			{
				result *= number;
				power--;
			}
			number *= number;
			power >>= 1;
		}
		return result;
	}